

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

string * el::base::utils::Str::toUpper(string *str)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  size_type sVar4;
  
  sVar1 = str->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (str->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      iVar3 = toupper((int)pcVar2[sVar4]);
      pcVar2[sVar4] = (char)iVar3;
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  return str;
}

Assistant:

std::string& Str::toUpper(std::string& str) {
  std::transform(str.begin(), str.end(), str.begin(),
  [](char c) {
    return static_cast<char>(::toupper(c));
  });
  return str;
}